

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

int64_t r_code::Utils::GetResilience(uint64_t now,uint64_t time_to_live,uint64_t upr)

{
  int64_t iVar1;
  ulong uVar2;
  
  iVar1 = 1;
  if (upr != 0 && time_to_live != 0) {
    uVar2 = (time_to_live + now) - TimeReference;
    iVar1 = ((uVar2 / upr - (now - TimeReference) / upr) + 1) - (ulong)(uVar2 % upr == 0);
  }
  return iVar1;
}

Assistant:

int64_t Utils::GetResilience(uint64_t now, uint64_t time_to_live, uint64_t upr)
{
    if (time_to_live == 0 || upr == 0) {
        return 1;
    }

    uint64_t deadline = now + time_to_live;
    uint64_t last_upr = (now - TimeReference) / upr;
    uint64_t next_upr = (deadline - TimeReference) / upr;

    if ((deadline - TimeReference) % upr > 0) {
        ++next_upr;
    }

    return next_upr - last_upr;
}